

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

int Kf_CutCompare(Kf_Cut_t *pCut0,Kf_Cut_t *pCut1,int fArea)

{
  int fArea_local;
  Kf_Cut_t *pCut1_local;
  Kf_Cut_t *pCut0_local;
  
  if (fArea == 0) {
    if (pCut0->Delay < pCut1->Delay) {
      return -1;
    }
    if (pCut1->Delay < pCut0->Delay) {
      return 1;
    }
    if (pCut0->nLeaves < pCut1->nLeaves) {
      return -1;
    }
    if (pCut1->nLeaves < pCut0->nLeaves) {
      return 1;
    }
    if (pCut0->Area < pCut1->Area) {
      return -1;
    }
    if (pCut1->Area <= pCut0->Area && pCut0->Area != pCut1->Area) {
      return 1;
    }
  }
  else {
    if (pCut0->Area < pCut1->Area) {
      return -1;
    }
    if (pCut1->Area <= pCut0->Area && pCut0->Area != pCut1->Area) {
      return 1;
    }
    if (pCut0->Delay < pCut1->Delay) {
      return -1;
    }
    if (pCut1->Delay < pCut0->Delay) {
      return 1;
    }
    if (pCut0->nLeaves < pCut1->nLeaves) {
      return -1;
    }
    if (pCut1->nLeaves < pCut0->nLeaves) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static inline int Kf_CutCompare( Kf_Cut_t * pCut0, Kf_Cut_t * pCut1, int fArea )
{
    if ( fArea )
    {
        if ( pCut0->Area    < pCut1->Area )    return -1;
        if ( pCut0->Area    > pCut1->Area )    return  1;
        if ( pCut0->Delay   < pCut1->Delay )   return -1;
        if ( pCut0->Delay   > pCut1->Delay )   return  1;
        if ( pCut0->nLeaves < pCut1->nLeaves ) return -1;
        if ( pCut0->nLeaves > pCut1->nLeaves ) return  1;
    }
    else
    {
        if ( pCut0->Delay   < pCut1->Delay )   return -1;
        if ( pCut0->Delay   > pCut1->Delay )   return  1;
        if ( pCut0->nLeaves < pCut1->nLeaves ) return -1;
        if ( pCut0->nLeaves > pCut1->nLeaves ) return  1;
        if ( pCut0->Area    < pCut1->Area )    return -1;
        if ( pCut0->Area    > pCut1->Area )    return  1;
    }
    return 0;
}